

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_rff.cpp
# Opt level: O3

int __thiscall FRFFLump::FillCache(FRFFLump *this)

{
  byte *pbVar1;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  
  iVar5 = FUncompressedLump::FillCache(&this->super_FUncompressedLump);
  if ((((this->super_FUncompressedLump).super_FResourceLump.Flags & 8) != 0) &&
     (uVar2 = (this->super_FUncompressedLump).super_FResourceLump.LumpSize, 0 < (int)uVar2)) {
    pcVar3 = (this->super_FUncompressedLump).super_FResourceLump.Cache;
    uVar4 = 0x100;
    if (uVar2 < 0x100) {
      uVar4 = uVar2;
    }
    uVar6 = 0;
    do {
      pbVar1 = (byte *)(pcVar3 + uVar6);
      *pbVar1 = *pbVar1 ^ (byte)(uVar6 >> 1);
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  return iVar5;
}

Assistant:

int FRFFLump::FillCache()
{
	int res = FUncompressedLump::FillCache();

	if (Flags & LUMPF_BLOODCRYPT)
	{
		int cryptlen = MIN<int> (LumpSize, 256);
		BYTE *data = (BYTE *)Cache;
		
		for (int i = 0; i < cryptlen; ++i)
		{
			data[i] ^= i >> 1;
		}
	}
	return res;
}